

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O2

uint ReadMatchDistances(CLzmaEnc *p,uint *numPairsRes)

{
  uint uVar1;
  UInt32 UVar2;
  int iVar3;
  uint uVar4;
  UInt32 *pUVar5;
  ulong uVar6;
  Byte *pBVar7;
  Byte *pBVar8;
  long lVar9;
  
  p->additionalOffset = p->additionalOffset + 1;
  UVar2 = (*(p->matchFinder).GetNumAvailableBytes)(p->matchFinderObj);
  p->numAvail = UVar2;
  pUVar5 = (*(p->matchFinder).GetMatches)(p->matchFinderObj,p->matches);
  uVar6 = (ulong)((long)pUVar5 - (long)p->matches) >> 2;
  uVar4 = (uint)uVar6;
  *numPairsRes = uVar4;
  if (uVar4 == 0) {
    uVar4 = 0;
  }
  else {
    uVar6 = uVar6 & 0xffffffff;
    uVar4 = p->matches[uVar6 - 2];
    if (uVar4 == p->numFastBytes) {
      uVar1 = 0x111;
      if (p->numAvail < 0x111) {
        uVar1 = p->numAvail;
      }
      pBVar7 = (*(p->matchFinder).GetPointerToCurrentPos)(p->matchFinderObj);
      pBVar8 = pBVar7 + ((ulong)uVar4 - 1);
      iVar3 = (int)pBVar7 + uVar1 + -1;
      for (lVar9 = (ulong)uVar1 - (ulong)uVar4; lVar9 != 0; lVar9 = lVar9 + -1) {
        if (*pBVar8 != pBVar8[-1 - (ulong)p->matches[uVar6 - 1]]) {
          iVar3 = (int)pBVar8;
          break;
        }
        pBVar8 = pBVar8 + 1;
      }
      uVar4 = iVar3 - ((int)pBVar7 + -1);
    }
  }
  return uVar4;
}

Assistant:

static unsigned ReadMatchDistances(CLzmaEnc *p, unsigned *numPairsRes)
{
  unsigned numPairs;
  
  p->additionalOffset++;
  p->numAvail = p->matchFinder.GetNumAvailableBytes(p->matchFinderObj);
  {
    const UInt32 *d = p->matchFinder.GetMatches(p->matchFinderObj, p->matches);
    // if (!d) { p->mf_Failure = True; *numPairsRes = 0;  return 0; }
    numPairs = (unsigned)(d - p->matches);
  }
  *numPairsRes = numPairs;
  
  #ifdef SHOW_STAT
  printf("\n i = %u numPairs = %u    ", g_STAT_OFFSET, numPairs / 2);
  g_STAT_OFFSET++;
  {
    unsigned i;
    for (i = 0; i < numPairs; i += 2)
      printf("%2u %6u   | ", p->matches[i], p->matches[i + 1]);
  }
  #endif
  
  if (numPairs == 0)
    return 0;
  {
    const unsigned len = p->matches[(size_t)numPairs - 2];
    if (len != p->numFastBytes)
      return len;
    {
      UInt32 numAvail = p->numAvail;
      if (numAvail > LZMA_MATCH_LEN_MAX)
        numAvail = LZMA_MATCH_LEN_MAX;
      {
        const Byte *p1 = p->matchFinder.GetPointerToCurrentPos(p->matchFinderObj) - 1;
        const Byte *p2 = p1 + len;
        const ptrdiff_t dif = (ptrdiff_t)-1 - (ptrdiff_t)p->matches[(size_t)numPairs - 1];
        const Byte *lim = p1 + numAvail;
        for (; p2 != lim && *p2 == p2[dif]; p2++)
        {}
        return (unsigned)(p2 - p1);
      }
    }
  }
}